

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxvolume.cc
# Opt level: O1

Int __thiscall ipx::Maxvolume::RunSequential(Maxvolume *this,double *colscale,Basis *basis)

{
  Int dim;
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  Int IVar5;
  int iVar6;
  Model *pMVar7;
  void *pvVar8;
  Int m;
  long lVar9;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  bool exchanged;
  vector<int,_std::allocator<int>_> candidates;
  Timer timer;
  IndexedVector ftran;
  bool local_c1;
  void *local_c0;
  double local_b8;
  Int local_b0;
  int local_ac;
  Basis *local_a8;
  ipxint local_9c;
  double *local_98;
  vector<int,_std::allocator<int>_> local_90;
  double local_78;
  double local_70;
  Timer local_68;
  IndexedVector local_60;
  
  local_a8 = basis;
  pMVar7 = Basis::model(basis);
  dim = pMVar7->num_rows_;
  local_b0 = pMVar7->num_cols_;
  IndexedVector::IndexedVector(&local_60,dim);
  Timer::Timer(&local_68);
  local_9c = (this->control_->parameters_).super_ipx_parameters.maxpasses;
  dVar13 = (this->control_->parameters_).super_ipx_parameters.volume_tol;
  local_70 = 1.0;
  if (1.0 <= dVar13) {
    local_70 = dVar13;
  }
  local_b8 = (double)CONCAT44(local_b8._4_4_,dim);
  uVar11 = (long)dim * 8;
  pvVar8 = operator_new(uVar11);
  IVar5 = 0;
  memset(pvVar8,0,uVar11);
  if (0 < local_b8._0_4_) {
    piVar3 = (local_a8->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = local_a8->model_->num_rows_;
    piVar4 = (local_a8->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    do {
      iVar10 = piVar3[lVar9];
      iVar6 = piVar4[iVar10];
      if ((-1 < iVar6) && (iVar6 < iVar1)) {
        dVar13 = 1.0;
        if (colscale != (double *)0x0) {
          dVar13 = 1.0 / colscale[iVar10];
        }
        *(double *)((long)pvVar8 + lVar9 * 8) = dVar13;
      }
      lVar9 = lVar9 + 1;
    } while (dim != lVar9);
  }
  local_98 = &this->tblmax_;
  this->volinc_ = 0.0;
  this->time_ = 0.0;
  this->updates_ = 0;
  this->skipped_ = 0;
  this->passes_ = 0;
  this->slices_ = 0;
  this->tblnnz_ = 0;
  this->tblmax_ = 0.0;
  this->frobnorm_squared_ = 0.0;
  local_b0 = local_b0 + local_b8._0_4_;
  local_c0 = pvVar8;
  do {
    pvVar8 = local_c0;
    if ((-1 < local_9c) && (local_9c <= this->passes_)) break;
    this->tblnnz_ = 0;
    *local_98 = 0.0;
    local_98[1] = 0.0;
    Sortperm(&local_90,local_b0,colscale,false);
    local_ac = 0;
    do {
      if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) break;
      iVar1 = local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish[-1];
      dVar13 = 1.0;
      if (colscale != (double *)0x0) {
        dVar13 = colscale[iVar1];
      }
      bVar12 = true;
      if ((dVar13 != 0.0) || (NAN(dVar13))) {
        if ((local_a8->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar1] == -1) {
          local_b8 = dVar13;
          IVar5 = Control::InterruptCheck(this->control_,-1);
          if (IVar5 == 0) {
            Basis::SolveForUpdate(local_a8,iVar1,&local_60);
            bVar12 = IndexedVector::sparse(&local_60);
            if (bVar12) {
              if ((long)local_60.nnz_ < 1) {
LAB_003abd77:
                iVar6 = -1;
                dVar14 = 0.0;
              }
              else {
                iVar10 = this->tblnnz_;
                dVar13 = this->frobnorm_squared_;
                iVar6 = -1;
                dVar14 = 0.0;
                lVar9 = 0;
                do {
                  iVar2 = local_60.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar9];
                  dVar15 = ABS(local_60.elements_._M_data[iVar2]) *
                           *(double *)((long)pvVar8 + (long)iVar2 * 8) * local_b8;
                  dVar16 = dVar15;
                  if (dVar15 <= dVar14) {
                    dVar16 = dVar14;
                    iVar2 = iVar6;
                  }
                  iVar6 = iVar2;
                  dVar14 = dVar16;
                  iVar10 = iVar10 + (uint)(dVar15 != 0.0);
                  this->tblnnz_ = iVar10;
                  dVar13 = dVar13 + dVar15 * dVar15;
                  this->frobnorm_squared_ = dVar13;
                  lVar9 = lVar9 + 1;
                } while (local_60.nnz_ != lVar9);
              }
            }
            else {
              if ((int)(uint)local_60.elements_._M_size < 1) goto LAB_003abd77;
              iVar10 = this->tblnnz_;
              dVar13 = this->frobnorm_squared_;
              iVar6 = -1;
              uVar11 = 0;
              dVar16 = 0.0;
              do {
                dVar15 = ABS(local_60.elements_._M_data[uVar11]) *
                         *(double *)((long)pvVar8 + uVar11 * 8) * local_b8;
                dVar14 = dVar15;
                if (dVar15 <= dVar16) {
                  dVar14 = dVar16;
                }
                if (dVar16 < dVar15) {
                  iVar6 = (int)uVar11;
                }
                iVar10 = iVar10 + (uint)(dVar15 != 0.0);
                dVar13 = dVar13 + dVar15 * dVar15;
                this->frobnorm_squared_ = dVar13;
                uVar11 = uVar11 + 1;
                dVar16 = dVar14;
              } while (((uint)local_60.elements_._M_size & 0x7fffffff) != uVar11);
              this->tblnnz_ = iVar10;
            }
            dVar13 = dVar14;
            if (dVar14 <= *local_98) {
              dVar13 = *local_98;
            }
            *local_98 = dVar13;
            if (dVar14 <= local_70) {
              this->skipped_ = this->skipped_ + 1;
              IVar5 = 0;
              goto LAB_003abbfb;
            }
            lVar9 = (long)iVar6;
            local_78 = dVar14;
            IVar5 = Basis::ExchangeIfStable
                              (local_a8,(local_a8->basis_).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start[lVar9],iVar1,
                               local_60.elements_._M_data[lVar9],-1,&local_c1);
            pvVar8 = local_c0;
            bVar12 = IVar5 != 0;
            if ((!bVar12) && (local_c1 == true)) {
              *(double *)((long)local_c0 + lVar9 * 8) = 1.0 / local_b8;
              local_ac = local_ac + 1;
              dVar13 = log2(local_78);
              this->volinc_ = dVar13 + this->volinc_;
              local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish = local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + -1;
            }
          }
        }
        else {
LAB_003abbfb:
          local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + -1;
          bVar12 = false;
        }
      }
    } while (!bVar12);
    this->updates_ = this->updates_ + local_ac;
    this->passes_ = this->passes_ + 1;
    bVar12 = local_ac != 0;
    if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  } while (bVar12 && IVar5 == 0);
  pvVar8 = local_c0;
  dVar13 = Timer::Elapsed(&local_68);
  this->time_ = dVar13;
  operator_delete(pvVar8);
  if (local_60.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  operator_delete(local_60.elements_._M_data);
  return IVar5;
}

Assistant:

Int Maxvolume::RunSequential(const double* colscale, Basis& basis) {
    const Model& model = basis.model();
    const Int m = model.rows();
    const Int n = model.cols();
    IndexedVector ftran(m);
    Timer timer;
    Int errflag = 0;

    const Int maxpasses = control_.maxpasses();
    const double volumetol = std::max(control_.volume_tol(), 1.0);

    // Maintain a copy of the inverse scaling factors of basic variables.
    // If a variable has status BASIC_FREE, its inverse scaling factor is
    // assumed zero, regardless of the entry in colscale. This ensures that
    // BASIC_FREE variables are never pivoted out of the basis.
    Vector invscale_basic(m);
    for (Int p = 0; p < m; p++) {
        Int j = basis[p];
        if (basis.StatusOf(j) == Basis::BASIC)
            invscale_basic[p] = colscale ? 1.0/colscale[j] : 1.0;
    }

    Reset();
    while (passes_ < maxpasses || maxpasses < 0) {
        tblnnz_ = 0;
        tblmax_ = 0.0;
        frobnorm_squared_ = 0.0;
        Int updates_last = 0;   // # basis updates in this pass
        std::vector<Int> candidates = Sortperm(n+m, colscale, false);
        while(!candidates.empty()) {
            Int j = candidates.back();
            const double dj = colscale ? colscale[j] : 1.0;
            if (dj == 0.0)      // all remaining columns have scaling factor 0
                break;
            if (basis.StatusOf(j) != Basis::NONBASIC) {
                candidates.pop_back();
                continue;
            }
            if ((errflag = control_.InterruptCheck()) != 0)
                break;
            basis.SolveForUpdate(j, ftran);
            Int pmax = -1;
            double vmax = 0.0;
            auto search_pivot = [&](Int p, double x) {
                double v = std::abs(x) * invscale_basic[p] * dj;
                if (v > vmax) {
                    vmax = v;
                    pmax = p;
                }
                tblnnz_ += v != 0;
                frobnorm_squared_ += v*v;
            };
            for_each_nonzero(ftran, search_pivot);
            tblmax_ = std::max(tblmax_, vmax);
            if (vmax <= volumetol) {
                skipped_++;
                candidates.pop_back();
                continue;
            }

            const Int jb = basis[pmax];
            assert(basis.StatusOf(jb) == Basis::BASIC);
            bool exchanged;
            errflag = basis.ExchangeIfStable(jb, j, ftran[pmax], -1, &exchanged);
            if (errflag)
                break;
            if (!exchanged)     // factorization was unstable, try again
                continue;
            invscale_basic[pmax] = 1.0 / dj;
            updates_last++;
            volinc_ += std::log2(vmax);
            candidates.pop_back();
        }
        updates_ += updates_last;
        passes_++;
        if (updates_last == 0 || errflag != 0)
            break;
    }
    time_ = timer.Elapsed();
    return errflag;
}